

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeGenerator.cpp
# Opt level: O3

PolymorphicEmitInfo __thiscall
Wasm::WasmBytecodeGenerator::EmitCall<(Wasm::WasmOp)16>(WasmBytecodeGenerator *this)

{
  ArenaAllocator *this_00;
  TypedRegisterAllocator *this_01;
  uint index;
  WasmSignature *this_02;
  IWasmByteCodeWriter *pIVar1;
  code *pcVar2;
  anon_union_8_2_2e7736b0_for_PolymorphicEmitInfo_1 aVar3;
  bool bVar4;
  ArgSlot AVar5;
  uint16 uVar6;
  ArgSlot AVar7;
  BOOL BVar8;
  Local LVar9;
  WasmType WVar10;
  RegSlot RVar11;
  EmitInfoBase EVar12;
  AsmJsRetType AVar13;
  undefined4 *puVar14;
  WasmBinaryReader *pWVar15;
  WasmFunctionInfo *pWVar16;
  EmitInfo EVar17;
  RegisterSpace *pRVar18;
  WasmRegisterSpace *pWVar19;
  EmitInfo EVar20;
  WasmCompilationException *this_03;
  byte bVar21;
  Type TVar22;
  undefined4 uVar23;
  undefined8 in_RDX;
  undefined7 uVar25;
  EmitInfo *pEVar24;
  ushort uVar26;
  ushort uVar27;
  long lVar28;
  ulong uVar29;
  WasmType WVar30;
  WasmType WVar31;
  WebAssemblyModule *this_04;
  ulong uVar32;
  ulong count;
  uint uVar33;
  uint32 uVar34;
  ulong uVar35;
  PolymorphicEmitInfo PVar36;
  EmitInfo local_a8;
  EmitInfo indirectIndexInfo;
  undefined1 local_88 [8];
  PolymorphicEmitInfo retInfo;
  EmitInfo *local_50;
  ushort local_38;
  anon_class_1_0_00000001 local_35;
  WasmType local_34;
  ArgSlot args;
  anon_class_1_0_00000001 argOverflow;
  
  local_a8.super_EmitInfoBase.location = 0xffffffff;
  local_a8.type = Void;
  pWVar15 = (WasmBinaryReader *)(this->m_funcInfo->m_customReader).ptr;
  uVar25 = (undefined7)((ulong)in_RDX >> 8);
  if (pWVar15 == (WasmBinaryReader *)0x0) {
    TVar22 = (((this->m_module->m_reader).ptr)->super_WasmReaderBase).m_currentNode.field_1.call.
             funcType;
    if (TVar22 == Function) {
      local_34 = Void;
    }
    else {
      local_34 = (WasmType)CONCAT71(uVar25,1);
      if (TVar22 != Import) goto LAB_00f22e22;
    }
LAB_00f22ead:
    this_04 = this->m_module;
    pWVar15 = (this_04->m_reader).ptr;
  }
  else {
    TVar22 = (pWVar15->super_WasmReaderBase).m_currentNode.field_1.call.funcType;
    if (TVar22 == Function) {
      local_34 = Void;
    }
    else {
      local_34 = (WasmType)CONCAT71(uVar25,1);
      if (TVar22 != Import) {
LAB_00f22e22:
        if (TVar22 != ImportThunk) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar14 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/WasmReader/WasmByteCodeGenerator.cpp"
                             ,0x449,
                             "(isImportCall || GetReader()->m_currentNode.call.funcType == FunctionIndexTypes::Function || GetReader()->m_currentNode.call.funcType == FunctionIndexTypes::ImportThunk)"
                             ,
                             "isImportCall || GetReader()->m_currentNode.call.funcType == FunctionIndexTypes::Function || GetReader()->m_currentNode.call.funcType == FunctionIndexTypes::ImportThunk"
                            );
          if (!bVar4) goto LAB_00f237c8;
          *puVar14 = 0;
          pWVar15 = (WasmBinaryReader *)(this->m_funcInfo->m_customReader).ptr;
        }
        local_34 = Void;
        if (pWVar15 == (WasmBinaryReader *)0x0) goto LAB_00f22ead;
      }
    }
    this_04 = this->m_module;
  }
  index = (pWVar15->super_WasmReaderBase).m_currentNode.field_1.br.depth;
  pWVar16 = Js::WebAssemblyModule::GetWasmFunctionInfo(this_04,index);
  pWVar15 = (WasmBinaryReader *)(this->m_funcInfo->m_customReader).ptr;
  if (pWVar15 == (WasmBinaryReader *)0x0) {
    pWVar15 = (this->m_module->m_reader).ptr;
  }
  this_02 = (pWVar16->m_signature).ptr;
  uVar26 = 0xffff;
  if (((pWVar15->super_WasmReaderBase).m_currentNode.field_1.call.funcType == Function) &&
     (bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,WasmInOutPhase), !bVar4)) {
    uVar26 = this->currentProfileId;
    this->currentProfileId = uVar26 + 1;
    if ((ushort)(uVar26 + 1) == 0) goto LAB_00f2373f;
  }
  if ((undefined1)local_34 == '\0') {
    uVar6 = WasmSignature::GetParamsSize(this_02);
    uVar27 = 0x1c;
  }
  else {
    AVar5 = WasmSignature::GetParamCount(this_02);
    uVar6 = UInt16Math::
            Mul<Wasm::WasmBytecodeGenerator::EmitCall<(Wasm::WasmOp)16>()::_lambda()_1_const>
                      (AVar5,8,&local_35);
    uVar27 = 0x11;
  }
  uVar6 = UInt16Math::
          Add<Wasm::WasmBytecodeGenerator::EmitCall<(Wasm::WasmOp)16>()::_lambda()_1_const>
                    (uVar6,8,&local_35);
  if ((uVar6 & 7) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar14 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/WasmReader/WasmByteCodeGenerator.cpp"
                       ,0x478,"((0))","Wasm argument size should always be Var aligned");
    if (!bVar4) {
LAB_00f237c8:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar14 = 0;
    this_03 = (WasmCompilationException *)__cxa_allocate_exception(8);
    WasmCompilationException::WasmCompilationException(this_03,L"Internal Error");
    goto LAB_00f237b2;
  }
  (*this->m_writer->_vptr_IWasmByteCodeWriter[0x1f])(this->m_writer,(ulong)uVar27,(ulong)uVar6,0);
  AVar5 = WasmSignature::GetParamCount(this_02);
  this_00 = &this->m_alloc;
  count = (ulong)AVar5;
  indirectIndexInfo.super_EmitInfoBase.location = index;
  if (AVar5 == 0) {
    local_50 = (EmitInfo *)&DAT_00000008;
  }
  else {
    BVar8 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar8 == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar14 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                         ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                         "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar4) goto LAB_00f237c8;
      *puVar14 = 0;
    }
    local_50 = (EmitInfo *)
               Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
               AllocInternal(&this_00->
                              super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                             ,(ulong)((uint)AVar5 * 8));
    if (local_50 == (EmitInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar14 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                         ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar4) goto LAB_00f237c8;
      *puVar14 = 0;
    }
    pEVar24 = local_50;
    do {
      pEVar24->super_EmitInfoBase = 0xffffffff;
      pEVar24->type = Void;
      pEVar24 = pEVar24 + 1;
    } while (pEVar24 != local_50 + count);
    if (count != 0) {
      lVar28 = count + 1;
      do {
        LVar9 = WasmSignature::GetParam(this_02,(short)lVar28 - 2);
        EVar17 = PopEvalStack(this,LVar9,L"Call argument does not match formal type");
        local_50[lVar28 + -2] = EVar17;
        lVar28 = lVar28 + -1;
      } while (1 < lVar28);
      if (count != 0) {
        puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        indirectIndexInfo.type = local_34 & 0xff ^ 0x145;
        bVar21 = (byte)local_34;
        bVar4 = bVar21 != 0;
        WVar30 = 0x21;
        if (bVar4) {
          WVar30 = 0x15;
        }
        WVar31 = 0x20;
        if (bVar4) {
          WVar31 = 0x14;
        }
        uVar23 = 0x22;
        if (bVar4) {
          uVar23 = 0x16;
        }
        retInfo.field_1.singleInfo.super_EmitInfoBase.location = (EmitInfoBase)(EmitInfoBase)uVar23;
        uVar35 = 1;
        uVar29 = 0;
LAB_00f2318e:
        WVar10 = local_50[uVar29].type;
        if (7 < WVar10 - FirstLocalType) {
switchD_00f231b8_caseD_6:
          WasmTypes::
          CompileAssertCasesNoFailFast<(Wasm::WasmTypes::WasmType)1,(Wasm::WasmTypes::WasmType)2,(Wasm::WasmTypes::WasmType)3,(Wasm::WasmTypes::WasmType)4,(Wasm::WasmTypes::WasmType)5>
                    ();
          this_03 = (WasmCompilationException *)__cxa_allocate_exception(8);
          WasmCompilationException::WasmCompilationException
                    (this_03,L"Unknown argument type %u",(ulong)WVar10);
          goto LAB_00f237b2;
        }
        uVar33 = local_50[uVar29].super_EmitInfoBase.location;
        uVar32 = (ulong)retInfo.field_1.infos & 0xffffffff;
        switch(WVar10) {
        case FirstLocalType:
          WVar10 = WVar31;
          break;
        case I64:
          WVar10 = WVar30;
          break;
        case F32:
          goto switchD_00f231b8_caseD_3;
        case F64:
          WVar10 = (uint)(bVar21 ^ 1) * 8 + 0x17;
          break;
        case V128:
          Simd::EnsureSimdIsEnabled();
          WVar10 = indirectIndexInfo.type;
          break;
        default:
          goto switchD_00f231b8_caseD_6;
        case Any:
          uVar32 = 0x14;
          if (this->isUnreachable != false) goto switchD_00f231b8_caseD_3;
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar14 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/WasmReader/WasmByteCodeGenerator.cpp"
                             ,0x4a6,"(IsUnreachable())","IsUnreachable()");
          if (!bVar4) goto LAB_00f237c8;
          *puVar14 = 0;
          if ((this->isUnreachable & 1U) == 0) goto switchD_00f231b8_caseD_6;
          goto switchD_00f231b8_caseD_3;
        }
        uVar32 = (ulong)WVar10;
switchD_00f231b8_caseD_3:
        (*this->m_writer->_vptr_IWasmByteCodeWriter[0xf])
                  (this->m_writer,uVar32 & 0xffff,uVar35,(ulong)uVar33);
        uVar33 = 1;
        if ((undefined1)local_34 == '\0') {
          AVar7 = WasmSignature::GetParamSize(this_02,(ArgSlot)uVar29);
          if ((AVar7 & 7) != 0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar14 = 1;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/WasmReader/WasmByteCodeGenerator.cpp"
                               ,0x4bc,
                               "(Math::IsAligned<Js::ArgSlot>(currentArgSize, sizeof(Js::Var)))",
                               "Math::IsAligned<Js::ArgSlot>(currentArgSize, sizeof(Js::Var))");
            if (!bVar4) goto LAB_00f237c8;
            *puVar14 = 0;
          }
          uVar33 = (uint)(AVar7 >> 3);
        }
        uVar35 = (ulong)((int)uVar35 + uVar33);
        uVar29 = uVar29 + 1;
        if (count == uVar29) goto LAB_00f23305;
        goto LAB_00f2318e;
      }
    }
  }
LAB_00f23305:
  this_01 = &this->mTypedRegisterAllocator;
  uVar33 = 1;
  pRVar18 = WAsmJs::TypedRegisterAllocator::GetRegisterSpace(this_01,INT64);
  RVar11 = WAsmJs::RegisterSpace::AcquireTmpRegister(pRVar18);
  if ((undefined1)local_34 == '\0') {
    uVar33 = this->m_module->m_importedFunctionCount + 1;
  }
  if (CARRY4(uVar33,indirectIndexInfo.super_EmitInfoBase.location)) {
LAB_00f2373f:
    Math::DefaultOverflowPolicy();
  }
  (*this->m_writer->_vptr_IWasmByteCodeWriter[0x18])
            (this->m_writer,0x4e,(ulong)RVar11,1,
             (ulong)(uVar33 + indirectIndexInfo.super_EmitInfoBase.location));
  local_88._0_4_ = 0;
  retInfo.count = 0;
  retInfo._4_4_ = 0;
  PolymorphicEmitInfo::Init((PolymorphicEmitInfo *)local_88,this_02->m_resultsCount,this_00);
  if (this_02->m_resultsCount != 0) {
    uVar34 = 0;
    do {
      LVar9 = WasmSignature::GetResult(this_02,uVar34);
      PolymorphicEmitInfo::SetInfo
                ((PolymorphicEmitInfo *)local_88,(EmitInfo)(((ulong)LVar9 << 0x20) + 0xffffffff),
                 uVar34);
      uVar34 = uVar34 + 1;
    } while (uVar34 < this_02->m_resultsCount);
  }
  if ((undefined1)local_34 == '\0') {
    pRVar18 = WAsmJs::TypedRegisterAllocator::GetRegisterSpace(this_01,INT64);
    WAsmJs::RegisterSpace::ReleaseTmpRegister(pRVar18,RVar11);
    ReleaseLocation(this,&local_a8);
    if (count != 0) {
      uVar29 = (ulong)((uint)AVar5 * 8);
      do {
        ReleaseLocation(this,(EmitInfo *)((long)&local_50[-1].super_EmitInfoBase.location + uVar29))
        ;
        uVar29 = uVar29 - 8;
      } while (uVar29 != 0);
    }
    if (this_02->m_resultsCount != 0) {
      uVar34 = 0;
      do {
        LVar9 = WasmSignature::GetResult(this_02,uVar34);
        pWVar19 = GetRegisterSpace(this,LVar9);
        EVar12.location = WAsmJs::RegisterSpace::AcquireTmpRegister(pWVar19);
        EVar17.type = LVar9;
        EVar17.super_EmitInfoBase.location = EVar12.location;
        PolymorphicEmitInfo::SetInfo((PolymorphicEmitInfo *)local_88,EVar17,uVar34);
        uVar34 = uVar34 + 1;
      } while (uVar34 < this_02->m_resultsCount);
    }
    if (local_88._0_4_ == 0) {
      WVar30 = Void;
      EVar20.super_EmitInfoBase.location = 0xffffffff;
      EVar20.type = Void;
    }
    else {
      EVar20 = PolymorphicEmitInfo::GetInfo((PolymorphicEmitInfo *)local_88,0);
      WVar30 = EVar20.type;
    }
    pIVar1 = this->m_writer;
    local_38 = uVar6 >> 3;
    AVar13 = WasmToAsmJs::GetAsmJsReturnType(WVar30);
    (*pIVar1->_vptr_IWasmByteCodeWriter[0x20])
              (pIVar1,0x1d,(ulong)EVar20 & 0xffffffff,RVar11,(ulong)(uVar6 >> 3),
               (ulong)AVar13.which_,(uint)uVar26);
    goto LAB_00f236d7;
  }
  local_38 = WasmSignature::GetParamCount(this_02);
  UInt16Math::Inc<Wasm::WasmBytecodeGenerator::EmitCall<(Wasm::WasmOp)16>()::_lambda()_1_const>
            (&local_38,&local_35);
  pRVar18 = WAsmJs::TypedRegisterAllocator::GetRegisterSpace(this_01,INT64);
  local_34 = WAsmJs::RegisterSpace::AcquireTmpRegister(pRVar18);
  uVar33 = this_02->m_resultsCount;
  if (1 < uVar33) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar14 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/WasmReader/WasmByteCodeGenerator.cpp"
                       ,0x4e8,"(calleeSignature->GetResultCount() <= 1)",
                       "Multiple results from function imports not supported");
    if (!bVar4) goto LAB_00f237c8;
    *puVar14 = 0;
    uVar33 = this_02->m_resultsCount;
  }
  if (uVar33 == 0) {
    retInfo.field_1.infos = (EmitInfo *)0x0;
  }
  else {
    LVar9 = WasmSignature::GetResult(this_02,0);
    retInfo.field_1.singleInfo.type = 0;
    retInfo.field_1.singleInfo.super_EmitInfoBase.location = (EmitInfoBase)(EmitInfoBase)LVar9;
  }
  pIVar1 = this->m_writer;
  uVar29 = (ulong)local_38;
  AVar13 = WasmToAsmJs::GetAsmJsReturnType
                     (retInfo.field_1.singleInfo.super_EmitInfoBase.location.location);
  WVar30 = local_34;
  (*pIVar1->_vptr_IWasmByteCodeWriter[0x20])
            (pIVar1,0x12,(ulong)local_34,(ulong)RVar11,uVar29,(ulong)AVar13.which_,(uint)uVar26);
  pRVar18 = WAsmJs::TypedRegisterAllocator::GetRegisterSpace(this_01,INT64);
  WAsmJs::RegisterSpace::ReleaseTmpRegister(pRVar18,WVar30);
  pRVar18 = WAsmJs::TypedRegisterAllocator::GetRegisterSpace(this_01,INT64);
  WAsmJs::RegisterSpace::ReleaseTmpRegister(pRVar18,RVar11);
  ReleaseLocation(this,&local_a8);
  if (count != 0) {
    uVar29 = (ulong)((uint)AVar5 * 8);
    do {
      ReleaseLocation(this,(EmitInfo *)((long)&local_50[-1].super_EmitInfoBase.location + uVar29));
      uVar29 = uVar29 - 8;
    } while (uVar29 != 0);
  }
  aVar3 = retInfo.field_1;
  if (this_02->m_resultsCount == 0) goto LAB_00f236d7;
  switch(retInfo.field_1.singleInfo.super_EmitInfoBase.location.location) {
  case 1:
    uVar26 = 0x18;
    break;
  case 2:
    uVar26 = 0x1b;
    break;
  case 3:
    uVar26 = 0x19;
    break;
  case 4:
    uVar26 = 0x1a;
    break;
  case 5:
    this_03 = (WasmCompilationException *)__cxa_allocate_exception(8);
    WasmCompilationException::WasmCompilationException
              (this_03,L"Return type: v128 not supported in import calls");
    goto LAB_00f237b2;
  default:
    WasmTypes::
    CompileAssertCasesNoFailFast<(Wasm::WasmTypes::WasmType)1,(Wasm::WasmTypes::WasmType)2,(Wasm::WasmTypes::WasmType)3,(Wasm::WasmTypes::WasmType)4,(Wasm::WasmTypes::WasmType)5>
              ();
    this_03 = (WasmCompilationException *)__cxa_allocate_exception(8);
    WasmCompilationException::WasmCompilationException
              (this_03,L"Unknown call return type %u",(ulong)aVar3.infos & 0xffffffff);
LAB_00f237b2:
    __cxa_throw(this_03,&WasmCompilationException::typeinfo,
                WasmCompilationException::~WasmCompilationException);
  }
  pWVar19 = GetRegisterSpace(this,retInfo.field_1.singleInfo.super_EmitInfoBase.location.location);
  RVar11 = WAsmJs::RegisterSpace::AcquireTmpRegister(pWVar19);
  PolymorphicEmitInfo::SetInfo
            ((PolymorphicEmitInfo *)local_88,(EmitInfo)((ulong)RVar11 | (long)aVar3.infos << 0x20),0
            );
  (*this->m_writer->_vptr_IWasmByteCodeWriter[0xf])
            (this->m_writer,(ulong)uVar26,(ulong)RVar11,(ulong)local_34);
LAB_00f236d7:
  Memory::DeleteArray<Memory::ArenaAllocator,Wasm::EmitInfo>(this_00,count,local_50);
  if (this->m_maxArgOutDepth <= (uint)local_38) {
    this->m_maxArgOutDepth = local_38 + 1;
  }
  PVar36._4_4_ = 0;
  PVar36.count = local_88._0_4_;
  PVar36.field_1 = (anon_union_8_2_2e7736b0_for_PolymorphicEmitInfo_1)retInfo._0_8_;
  return PVar36;
}

Assistant:

PolymorphicEmitInfo WasmBytecodeGenerator::EmitCall()
{
    uint32 funcNum = Js::Constants::UninitializedValue;
    uint32 signatureId = Js::Constants::UninitializedValue;
    WasmSignature* calleeSignature = nullptr;
    Js::ProfileId profileId = Js::Constants::NoProfileId;
    EmitInfo indirectIndexInfo;
    const bool isImportCall = GetReader()->m_currentNode.call.funcType == FunctionIndexTypes::Import;
    Assert(isImportCall || GetReader()->m_currentNode.call.funcType == FunctionIndexTypes::Function || GetReader()->m_currentNode.call.funcType == FunctionIndexTypes::ImportThunk);
    switch (wasmOp)
    {
    case wbCall:
    {
        funcNum = GetReader()->m_currentNode.call.num;
        WasmFunctionInfo* calleeInfo = m_module->GetWasmFunctionInfo(funcNum);
        calleeSignature = calleeInfo->GetSignature();
        // currently only handle inlining internal function calls
        // in future we can expand to all calls by adding checks in inliner and falling back to call in case ScriptFunction doesn't match
        if (GetReader()->m_currentNode.call.funcType == FunctionIndexTypes::Function && !PHASE_TRACE1(Js::WasmInOutPhase))
        {
            profileId = GetNextProfileId();
        }
        break;
    }
    case wbCallIndirect:
        indirectIndexInfo = PopEvalStack(WasmTypes::I32, _u("Indirect call index must be int type"));
        signatureId = GetReader()->m_currentNode.call.num;
        calleeSignature = m_module->GetSignature(signatureId);
        break;
    default:
        Assume(UNREACHED);
    }

    const auto argOverflow = []
    {
        throw WasmCompilationException(_u("Argument size too big"));
    };

    // emit start call
    Js::ArgSlot argSize;
    Js::OpCodeAsmJs startCallOp;
    if (isImportCall)
    {
        argSize = ArgSlotMath::Mul(calleeSignature->GetParamCount(), sizeof(Js::Var), argOverflow);
        startCallOp = Js::OpCodeAsmJs::StartCall;
    }
    else
    {
        startCallOp = Js::OpCodeAsmJs::I_StartCall;
        argSize = calleeSignature->GetParamsSize();
    }
    // Add return value
    argSize = ArgSlotMath::Add(argSize, sizeof(Js::Var), argOverflow);
    if (!Math::IsAligned<Js::ArgSlot>(argSize, sizeof(Js::Var)))
    {
        AssertMsg(UNREACHED, "Wasm argument size should always be Var aligned");
        throw WasmCompilationException(_u("Internal Error"));
    }

    m_writer->AsmStartCall(startCallOp, argSize);

    Js::ArgSlot nArgs = calleeSignature->GetParamCount();

    // copy args into a list so they could be generated in the right order (FIFO)
    EmitInfo* argsList = AnewArray(&m_alloc, EmitInfo, nArgs);
    for (int i = int(nArgs) - 1; i >= 0; --i)
    {
        EmitInfo info = PopEvalStack(calleeSignature->GetParam((Js::ArgSlot)i), _u("Call argument does not match formal type"));
        // We can release the location of the arguments now, because we won't create new temps between start/call
        argsList[i] = info;
    }

    // Skip the this pointer (aka undefined)
    uint32 argLoc = 1;
    for (Js::ArgSlot i = 0; i < nArgs; ++i)
    {
        EmitInfo info = argsList[i];

        Js::OpCodeAsmJs argOp = Js::OpCodeAsmJs::Nop;
        switch (info.type)
        {
        case WasmTypes::F32:
            argOp = isImportCall ? Js::OpCodeAsmJs::ArgOut_Flt : Js::OpCodeAsmJs::I_ArgOut_Flt;
            break;
        case WasmTypes::F64:
            argOp = isImportCall ? Js::OpCodeAsmJs::ArgOut_Db : Js::OpCodeAsmJs::I_ArgOut_Db;
            break;
        case WasmTypes::I32:
            argOp = isImportCall ? Js::OpCodeAsmJs::ArgOut_Int : Js::OpCodeAsmJs::I_ArgOut_Int;
            break;
        case WasmTypes::I64:
            argOp = isImportCall ? Js::OpCodeAsmJs::ArgOut_Long : Js::OpCodeAsmJs::I_ArgOut_Long;
            break;
#ifdef ENABLE_WASM_SIMD
        case WasmTypes::V128:
            Simd::EnsureSimdIsEnabled();
            argOp = isImportCall ? Js::OpCodeAsmJs::Simd128_ArgOut_F4 : Js::OpCodeAsmJs::Simd128_I_ArgOut_F4;
            break;
#endif
        case WasmTypes::Any:
            // In unreachable mode allow any type as argument since we won't actually emit the call
            Assert(IsUnreachable());
            if (IsUnreachable())
            {
                argOp = Js::OpCodeAsmJs::ArgOut_Int;
                break;
            }
            // Fall through
        default:
            WasmTypes::CompileAssertCasesNoFailFast<WasmTypes::I32, WasmTypes::I64, WasmTypes::F32, WasmTypes::F64, WASM_V128_CHECK_TYPE>();
            throw WasmCompilationException(_u("Unknown argument type %u"), info.type);
        }

        m_writer->AsmReg2(argOp, argLoc, info.location);

        // Calculated next argument Js::Var location
        if (isImportCall)
        {
            ++argLoc;
        }
        else
        {
            const Js::ArgSlot currentArgSize = calleeSignature->GetParamSize(i);
            Assert(Math::IsAligned<Js::ArgSlot>(currentArgSize, sizeof(Js::Var)));
            argLoc += currentArgSize / sizeof(Js::Var);
        }
    }

    Js::RegSlot funcReg = GetRegisterSpace(WasmTypes::Ptr)->AcquireTmpRegister();

    // emit call
    switch (wasmOp)
    {
    case wbCall:
    {
        uint32 offset = isImportCall ? m_module->GetImportFuncOffset() : m_module->GetFuncOffset();
        uint32 index = UInt32Math::Add(offset, funcNum);
        m_writer->AsmSlot(Js::OpCodeAsmJs::LdSlot, funcReg, Js::AsmJsFunctionMemory::ModuleEnvRegister, index);
        break;
    }
    case wbCallIndirect:
    {
        Js::RegSlot slotReg = GetRegisterSpace(WasmTypes::Ptr)->AcquireTmpRegister();
        m_writer->AsmSlot(Js::OpCodeAsmJs::LdSlotArr, slotReg, Js::AsmJsFunctionMemory::ModuleEnvRegister, m_module->GetTableEnvironmentOffset());
        m_writer->AsmSlot(Js::OpCodeAsmJs::LdArr_WasmFunc, funcReg, slotReg, indirectIndexInfo.location);
        GetRegisterSpace(WasmTypes::Ptr)->ReleaseTmpRegister(slotReg);
        m_writer->AsmReg1IntConst1(Js::OpCodeAsmJs::CheckSignature, funcReg, calleeSignature->GetSignatureId());
        break;
    }
    default:
        Assume(UNREACHED);
    }

    // calculate number of RegSlots(Js::Var) the call consumes
    PolymorphicEmitInfo retInfo;
    retInfo.Init(calleeSignature->GetResultCount(), &m_alloc);
    for (uint32 i = 0; i < calleeSignature->GetResultCount(); ++i)
    {
        retInfo.SetInfo(EmitInfo(calleeSignature->GetResult(i)), i);
    }
    Js::ArgSlot args;
    if (isImportCall)
    {
        args = calleeSignature->GetParamCount();
        ArgSlotMath::Inc(args, argOverflow);

        Js::RegSlot varRetReg = GetRegisterSpace(WasmTypes::Ptr)->AcquireTmpRegister();
        AssertOrFailFastMsg(calleeSignature->GetResultCount() <= 1, "Multiple results from function imports not supported");
        WasmTypes::WasmType singleResType = calleeSignature->GetResultCount() > 0 ? calleeSignature->GetResult(0) : WasmTypes::Void;
        m_writer->AsmCall(Js::OpCodeAsmJs::Call, varRetReg, funcReg, args, WasmToAsmJs::GetAsmJsReturnType(singleResType), profileId);

        GetRegisterSpace(WasmTypes::Ptr)->ReleaseTmpRegister(varRetReg);
        GetRegisterSpace(WasmTypes::Ptr)->ReleaseTmpRegister(funcReg);

        ReleaseLocation(&indirectIndexInfo);
        //registers need to be released from higher ordinals to lower
        for (uint32 i = nArgs; i > 0; --i)
        {
            ReleaseLocation(&(argsList[i - 1]));
        }

        // emit result coercion
        if (calleeSignature->GetResultCount() > 0)
        {
            Js::OpCodeAsmJs convertOp = Js::OpCodeAsmJs::Nop;
            switch (singleResType)
            {
            case WasmTypes::F32:
                convertOp = Js::OpCodeAsmJs::Conv_VTF;
                break;
            case WasmTypes::F64:
                convertOp = Js::OpCodeAsmJs::Conv_VTD;
                break;
            case WasmTypes::I32:
                convertOp = Js::OpCodeAsmJs::Conv_VTI;
                break;
            case WasmTypes::I64:
                convertOp = Js::OpCodeAsmJs::Conv_VTL;
                break;
#ifdef ENABLE_WASM_SIMD
            case WasmTypes::V128:
                throw WasmCompilationException(_u("Return type: v128 not supported in import calls"));
#endif
            default:
                WasmTypes::CompileAssertCasesNoFailFast<WasmTypes::I32, WasmTypes::I64, WasmTypes::F32, WasmTypes::F64, WASM_V128_CHECK_TYPE>();
                throw WasmCompilationException(_u("Unknown call return type %u"), singleResType);
            }
            Js::RegSlot location = GetRegisterSpace(singleResType)->AcquireTmpRegister();
            retInfo.SetInfo(EmitInfo(location, singleResType), 0);
            m_writer->AsmReg2(convertOp, location, varRetReg);
        }
    }
    else
    {
        GetRegisterSpace(WasmTypes::Ptr)->ReleaseTmpRegister(funcReg);
        ReleaseLocation(&indirectIndexInfo);
        //registers need to be released from higher ordinals to lower
        for (uint32 i = nArgs; i > 0; --i)
        {
            ReleaseLocation(&(argsList[i - 1]));
        }

        for (uint32 i = 0; i < calleeSignature->GetResultCount(); ++i)
        {
            EmitInfo info(calleeSignature->GetResult(i));
            info.location = GetRegisterSpace(info.type)->AcquireTmpRegister();
            retInfo.SetInfo(info, i);
        }

        EmitInfo singleResultInfo = retInfo.Count() > 0 ? retInfo.GetInfo(0) : EmitInfo(WasmTypes::Void);
        args = (Js::ArgSlot)(::ceil((double)(argSize / sizeof(Js::Var))));
        // todo:: add bytecode to call and set aside multi results
        m_writer->AsmCall(Js::OpCodeAsmJs::I_Call, singleResultInfo.location, funcReg, args, WasmToAsmJs::GetAsmJsReturnType(singleResultInfo.type), profileId);
    }
    AdeleteArray(&m_alloc, nArgs, argsList);

    // WebAssemblyArrayBuffer is not detachable, no need to check for detached state here

    // track stack requirements for out params

    // + 1 for return address
    uint32 maxDepthForLevel = args + 1;
    if (maxDepthForLevel > m_maxArgOutDepth)
    {
        m_maxArgOutDepth = maxDepthForLevel;
    }

    return retInfo;
}